

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jieba.cc
# Opt level: O3

void jieba_add_user_words(jieba_t *handle,char **words,size_t count)

{
  char *__end;
  size_t sVar1;
  allocator local_79;
  char **local_78;
  string local_70;
  string local_50;
  
  if (count != 0) {
    sVar1 = 0;
    local_78 = words;
    do {
      std::__cxx11::string::string((string *)&local_50,local_78[sVar1],&local_79);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"","");
      cppjieba::DictTrie::InsertUserWord((DictTrie *)handle,&local_50,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      sVar1 = sVar1 + 1;
    } while (count != sVar1);
  }
  return;
}

Assistant:

void jieba_add_user_words(jieba_t* handle, const char** words, size_t count) {
  cppjieba::Jieba* x = (cppjieba::Jieba*)handle;
  for (size_t i = 0; i < count; i++) {
    x->InsertUserWord(words[i]);
  }
}